

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O0

intptr_t Col_IntWordValue(Col_Word word)

{
  uint local_24;
  uint local_20;
  uint local_1c;
  Col_Word word_local;
  
  if (word == 0) {
    local_1c = 0;
  }
  else {
    if ((word & 0xf) == 0) {
      if ((*(byte *)word & 2) == 0) {
        local_24 = 0xffffffff;
      }
      else {
        local_24 = *(byte *)word & 0xfffffffe;
      }
      local_20 = local_24;
    }
    else {
      local_20 = immediateWordTypes[word & 0x1f];
    }
    local_1c = local_20;
  }
  if (local_1c == 0xfffffffe) {
    word_local = (long)word >> 1;
  }
  else if ((local_1c == 2) && (*(short *)(word + 2) == 4)) {
    word_local = *(Col_Word *)(word + 0x10);
  }
  else {
    word_local = 0;
  }
  return word_local;
}

Assistant:

intptr_t
Col_IntWordValue(
    Col_Word word)  /*!< Integer word to get value for. */
{
    switch (WORD_TYPE(word)) {
    case WORD_TYPE_SMALLINT:
        return WORD_SMALLINT_VALUE(word);

    case WORD_TYPE_WRAP:
        if (WORD_WRAP_TYPE(word) == COL_INT) {
            return WORD_INTWRAP_VALUE(word);
        }
    }

    /*! @typecheck{COL_ERROR_INT,word} */
    TYPECHECK(0, COL_ERROR_INT, word);

    return 0;
}